

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarkContext.cpp
# Opt level: O3

void __thiscall Memory::MarkContext::Clear(MarkContext *this)

{
  (this->markStack).currentChunk = (Chunk *)0x0;
  (this->markStack).nextEntry = (MarkCandidate *)0x0;
  (this->markStack).count = 0;
  (this->markStack).pageCount = 0;
  (this->trackStack).currentChunk = (Chunk *)0x0;
  (this->trackStack).nextEntry = (FinalizableObject **)0x0;
  (this->trackStack).count = 0;
  (this->trackStack).pageCount = 0;
  return;
}

Assistant:

void MarkContext::Clear()
{
    markStack.Clear();
#ifdef RECYCLER_VISITED_HOST
    preciseStack.Clear();
#endif
    trackStack.Clear();
}